

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermOut.cpp
# Opt level: O0

bool __thiscall
glslang::TOutputTraverser::visitBinary(TOutputTraverser *this,TVisit param_1,TIntermBinary *node)

{
  TOperator TVar1;
  int iVar2;
  long *plVar3;
  TType *pTVar4;
  TIntermConstantUnion *this_00;
  TConstUnionArray *this_01;
  TConstUnion *this_02;
  const_reference pvVar5;
  undefined4 extraout_var;
  TInfoSinkBase *pTVar6;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *local_70;
  TString local_60;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *local_38;
  TTypeList *members;
  TInfoSink *pTStack_28;
  bool reference;
  TInfoSink *out;
  TIntermBinary *node_local;
  TOutputTraverser *pTStack_10;
  TVisit param_1_local;
  TOutputTraverser *this_local;
  
  pTStack_28 = this->infoSink;
  out = (TInfoSink *)node;
  node_local._4_4_ = param_1;
  pTStack_10 = this;
  OutputTreeText(pTStack_28,(TIntermNode *)node,(this->super_TIntermTraverser).depth);
  TVar1 = TIntermOperator::getOp((TIntermOperator *)out);
  if (TVar1 == EOpAdd) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"add");
  }
  else if (TVar1 == EOpSub) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"subtract");
  }
  else if (TVar1 == EOpMul) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"component-wise multiply");
  }
  else if (TVar1 == EOpDiv) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"divide");
  }
  else if (TVar1 == EOpMod) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"mod");
  }
  else if (TVar1 == EOpRightShift) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"right-shift");
  }
  else if (TVar1 == EOpLeftShift) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"left-shift");
  }
  else if (TVar1 == EOpAnd) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"bitwise and");
  }
  else if (TVar1 == EOpInclusiveOr) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"inclusive-or");
  }
  else if (TVar1 == EOpExclusiveOr) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"exclusive-or");
  }
  else if (TVar1 == EOpEqual) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"Compare Equal");
  }
  else if (TVar1 == EOpNotEqual) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"Compare Not Equal");
  }
  else if (TVar1 == EOpVectorEqual) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"Equal");
  }
  else if (TVar1 == EOpVectorNotEqual) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"NotEqual");
  }
  else if (TVar1 == EOpLessThan) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"Compare Less Than");
  }
  else if (TVar1 == EOpGreaterThan) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"Compare Greater Than");
  }
  else if (TVar1 == EOpLessThanEqual) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"Compare Less Than or Equal");
  }
  else if (TVar1 == EOpGreaterThanEqual) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"Compare Greater Than or Equal");
  }
  else if (TVar1 == EOpVectorTimesScalar) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"vector-scale");
  }
  else if (TVar1 == EOpVectorTimesMatrix) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"vector-times-matrix");
  }
  else if (TVar1 == EOpMatrixTimesVector) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"matrix-times-vector");
  }
  else if (TVar1 == EOpMatrixTimesScalar) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"matrix-scale");
  }
  else if (TVar1 == EOpLogicalOr) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"logical-or");
  }
  else if (TVar1 == EOpLogicalXor) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"logical-xor");
  }
  else if (TVar1 == EOpLogicalAnd) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"logical-and");
  }
  else if (TVar1 == EOpIndexDirect) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"direct index");
  }
  else if (TVar1 == EOpIndexIndirect) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"indirect index");
  }
  else if (TVar1 == EOpIndexDirectStruct) {
    plVar3 = (long *)(**(code **)(*(long *)&(out->info).sink + 400))();
    pTVar4 = (TType *)(**(code **)(*plVar3 + 0xf0))();
    members._7_1_ = TType::isReference(pTVar4);
    if ((bool)members._7_1_) {
      plVar3 = (long *)(**(code **)(*(long *)&(out->info).sink + 400))();
      plVar3 = (long *)(**(code **)(*plVar3 + 0xf0))();
      pTVar4 = (TType *)(**(code **)(*plVar3 + 0xa8))();
      local_70 = &TType::getStruct(pTVar4)->
                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
    }
    else {
      plVar3 = (long *)(**(code **)(*(long *)&(out->info).sink + 400))();
      pTVar4 = (TType *)(**(code **)(*plVar3 + 0xf0))();
      local_70 = &TType::getStruct(pTVar4)->
                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
    }
    local_38 = local_70;
    pTVar6 = &pTStack_28->debug;
    plVar3 = (long *)(**(code **)(*(long *)&(out->info).sink + 0x198))();
    this_00 = (TIntermConstantUnion *)(**(code **)(*plVar3 + 0x28))();
    this_01 = TIntermConstantUnion::getConstArray(this_00);
    this_02 = TConstUnionArray::operator[](this_01,0);
    iVar2 = TConstUnion::getIConst(this_02);
    pvVar5 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::operator[]
                       (local_70,(long)iVar2);
    iVar2 = (*pvVar5->type->_vptr_TType[6])();
    TInfoSinkBase::operator<<(pTVar6,(TString *)CONCAT44(extraout_var,iVar2));
    TInfoSinkBase::operator<<(&pTStack_28->debug,": direct index for structure");
  }
  else if (TVar1 == EOpVectorSwizzle) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"vector swizzle");
  }
  else if (TVar1 == EOpMatrixTimesMatrix) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"matrix-multiply");
  }
  else if (TVar1 == EOpAssign) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"move second child to first child");
  }
  else if (TVar1 == EOpAddAssign) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"add second child into first child");
  }
  else if (TVar1 == EOpSubAssign) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"subtract second child into first child");
  }
  else if (TVar1 == EOpMulAssign) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"multiply second child into first child");
  }
  else if (TVar1 == EOpVectorTimesMatrixAssign) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"matrix mult second child into first child");
  }
  else if (TVar1 == EOpVectorTimesScalarAssign) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"vector scale second child into first child");
  }
  else if (TVar1 == EOpMatrixTimesScalarAssign) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"matrix scale second child into first child");
  }
  else if (TVar1 == EOpMatrixTimesMatrixAssign) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"matrix mult second child into first child");
  }
  else if (TVar1 == EOpDivAssign) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"divide second child into first child");
  }
  else if (TVar1 == EOpModAssign) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"mod second child into first child");
  }
  else if (TVar1 == EOpAndAssign) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"and second child into first child");
  }
  else if (TVar1 == EOpInclusiveOrAssign) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"or second child into first child");
  }
  else if (TVar1 == EOpExclusiveOrAssign) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"exclusive or second child into first child");
  }
  else if (TVar1 == EOpLeftShiftAssign) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"left shift second child into first child");
  }
  else if (TVar1 == EOpRightShiftAssign) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"right shift second child into first child");
  }
  else if (TVar1 == EOpAbsDifference) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"absoluteDifference");
  }
  else if (TVar1 == EOpAddSaturate) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"addSaturate");
  }
  else if (TVar1 == EOpSubSaturate) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"subtractSaturate");
  }
  else if (TVar1 == EOpAverage) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"average");
  }
  else if (TVar1 == EOpAverageRounded) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"averageRounded");
  }
  else if (TVar1 == EOpMul32x16) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"multiply32x16");
  }
  else if (TVar1 == EOpMatrixSwizzle) {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"matrix swizzle");
  }
  else {
    TInfoSinkBase::operator<<(&pTStack_28->debug,"<unknown op>");
  }
  pTVar6 = TInfoSinkBase::operator<<(&pTStack_28->debug," (");
  TIntermOperator::getCompleteString_abi_cxx11_(&local_60,(TIntermOperator *)out);
  pTVar6 = TInfoSinkBase::operator<<(pTVar6,&local_60);
  TInfoSinkBase::operator<<(pTVar6,")");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string(&local_60);
  TInfoSinkBase::operator<<(&pTStack_28->debug,"\n");
  return true;
}

Assistant:

bool TOutputTraverser::visitBinary(TVisit /* visit */, TIntermBinary* node)
{
    TInfoSink& out = infoSink;

    OutputTreeText(out, node, depth);

    switch (node->getOp()) {
    case EOpAssign:                   out.debug << "move second child to first child";           break;
    case EOpAddAssign:                out.debug << "add second child into first child";          break;
    case EOpSubAssign:                out.debug << "subtract second child into first child";     break;
    case EOpMulAssign:                out.debug << "multiply second child into first child";     break;
    case EOpVectorTimesMatrixAssign:  out.debug << "matrix mult second child into first child";  break;
    case EOpVectorTimesScalarAssign:  out.debug << "vector scale second child into first child"; break;
    case EOpMatrixTimesScalarAssign:  out.debug << "matrix scale second child into first child"; break;
    case EOpMatrixTimesMatrixAssign:  out.debug << "matrix mult second child into first child";  break;
    case EOpDivAssign:                out.debug << "divide second child into first child";       break;
    case EOpModAssign:                out.debug << "mod second child into first child";          break;
    case EOpAndAssign:                out.debug << "and second child into first child";          break;
    case EOpInclusiveOrAssign:        out.debug << "or second child into first child";           break;
    case EOpExclusiveOrAssign:        out.debug << "exclusive or second child into first child"; break;
    case EOpLeftShiftAssign:          out.debug << "left shift second child into first child";   break;
    case EOpRightShiftAssign:         out.debug << "right shift second child into first child";  break;

    case EOpIndexDirect:   out.debug << "direct index";   break;
    case EOpIndexIndirect: out.debug << "indirect index"; break;
    case EOpIndexDirectStruct:
        {
            bool reference = node->getLeft()->getType().isReference();
            const TTypeList *members = reference ? node->getLeft()->getType().getReferentType()->getStruct() : node->getLeft()->getType().getStruct();
            out.debug << (*members)[node->getRight()->getAsConstantUnion()->getConstArray()[0].getIConst()].type->getFieldName();
            out.debug << ": direct index for structure";      break;
        }
    case EOpVectorSwizzle: out.debug << "vector swizzle"; break;
    case EOpMatrixSwizzle: out.debug << "matrix swizzle"; break;

    case EOpAdd:    out.debug << "add";                     break;
    case EOpSub:    out.debug << "subtract";                break;
    case EOpMul:    out.debug << "component-wise multiply"; break;
    case EOpDiv:    out.debug << "divide";                  break;
    case EOpMod:    out.debug << "mod";                     break;
    case EOpRightShift:  out.debug << "right-shift";  break;
    case EOpLeftShift:   out.debug << "left-shift";   break;
    case EOpAnd:         out.debug << "bitwise and";  break;
    case EOpInclusiveOr: out.debug << "inclusive-or"; break;
    case EOpExclusiveOr: out.debug << "exclusive-or"; break;
    case EOpEqual:            out.debug << "Compare Equal";                 break;
    case EOpNotEqual:         out.debug << "Compare Not Equal";             break;
    case EOpLessThan:         out.debug << "Compare Less Than";             break;
    case EOpGreaterThan:      out.debug << "Compare Greater Than";          break;
    case EOpLessThanEqual:    out.debug << "Compare Less Than or Equal";    break;
    case EOpGreaterThanEqual: out.debug << "Compare Greater Than or Equal"; break;
    case EOpVectorEqual:      out.debug << "Equal";                         break;
    case EOpVectorNotEqual:   out.debug << "NotEqual";                      break;

    case EOpVectorTimesScalar: out.debug << "vector-scale";          break;
    case EOpVectorTimesMatrix: out.debug << "vector-times-matrix";   break;
    case EOpMatrixTimesVector: out.debug << "matrix-times-vector";   break;
    case EOpMatrixTimesScalar: out.debug << "matrix-scale";          break;
    case EOpMatrixTimesMatrix: out.debug << "matrix-multiply";       break;

    case EOpLogicalOr:  out.debug << "logical-or";   break;
    case EOpLogicalXor: out.debug << "logical-xor"; break;
    case EOpLogicalAnd: out.debug << "logical-and"; break;

    case EOpAbsDifference:          out.debug << "absoluteDifference";    break;
    case EOpAddSaturate:            out.debug << "addSaturate";           break;
    case EOpSubSaturate:            out.debug << "subtractSaturate";      break;
    case EOpAverage:                out.debug << "average";               break;
    case EOpAverageRounded:         out.debug << "averageRounded";        break;
    case EOpMul32x16:               out.debug << "multiply32x16";         break;

    default: out.debug << "<unknown op>";
    }

    out.debug << " (" << node->getCompleteString() << ")";

    out.debug << "\n";

    return true;
}